

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

int __thiscall RenX::Server::sendAdminMessage(Server *this,string_view message)

{
  int iVar1;
  char *in_RCX;
  string_view str;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  __sv_type local_30;
  Server *local_20;
  Server *this_local;
  string_view message_local;
  
  message_local._M_len = (size_t)message._M_str;
  this_local = (Server *)message._M_len;
  local_20 = this;
  s_abi_cxx11_(&local_90,"camsg ",6);
  str._M_str = in_RCX;
  str._M_len = message_local._M_len;
  escapifyRCON_abi_cxx11_(&local_b0,(RenX *)this_local,str);
  std::operator+(&local_70,&local_90,&local_b0);
  std::operator+(&local_50,&local_70,'\n');
  local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  iVar1 = sendSocket(this,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return iVar1;
}

Assistant:

int RenX::Server::sendAdminMessage(std::string_view message) {
	return sendSocket("camsg "s + RenX::escapifyRCON(message) + '\n');
}